

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O2

Abc_Obj_t * Abc_NtkCovDerive_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  Min_Cube_t *pCover;
  Min_Cube_t *pCover_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *vSupp;
  Cov_Obj_t *pCVar3;
  Min_Cube_t *pCover_01;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Str_t *vCover;
  char *pcVar6;
  Min_Cube_t *pCover_02;
  bool bVar7;
  char local_54;
  int local_44;
  
  if ((Abc_Obj_t *)(pObj->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pObj->field_6).pTemp;
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covBuild.c"
                  ,0x197,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  vSupp = Abc_ObjGetSupp(pObj);
  if (vSupp == (Vec_Int_t *)0x0) {
    __assert_fail("vSupp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covBuild.c"
                  ,0x19a,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pCVar3 = Abc_ObjGetStr(pObj);
  pCover = pCVar3->pCover[0];
  pCVar3 = Abc_ObjGetStr(pObj);
  pCover_00 = pCVar3->pCover[1];
  pCover_01 = Abc_ObjGetCover2(pObj);
  bVar7 = pCover == (Min_Cube_t *)0x0;
  if (bVar7) {
    if (pCover_00 == (Min_Cube_t *)0x0) goto LAB_0034140a;
LAB_0034141f:
    local_54 = '0';
    local_44 = 1;
    pCover_02 = pCover_00;
    if (pCover_01 == (Min_Cube_t *)0x0) goto LAB_003414e8;
    iVar1 = Min_CoverCountCubes(pCover_00);
    iVar2 = Min_CoverCountCubes(pCover_01);
    if (iVar1 <= iVar2) goto LAB_003414e8;
    bVar7 = false;
LAB_00341462:
    if (pCover != (Min_Cube_t *)0x0) goto LAB_00341467;
  }
  else {
    if (pCover_00 != (Min_Cube_t *)0x0) {
      iVar1 = Min_CoverCountCubes(pCover);
      iVar2 = Min_CoverCountCubes(pCover_00);
      if (iVar1 <= iVar2) goto LAB_00341399;
LAB_003413e1:
      iVar1 = Min_CoverCountCubes(pCover_00);
      iVar2 = Min_CoverCountCubes(pCover);
      if (iVar1 <= iVar2) goto LAB_0034141f;
LAB_0034140a:
      if (pCover_01 == (Min_Cube_t *)0x0) goto LAB_003414ba;
      goto LAB_00341462;
    }
LAB_00341399:
    local_54 = '1';
    local_44 = 0;
    pCover_02 = pCover;
    if (pCover_01 == (Min_Cube_t *)0x0) goto LAB_003414e8;
    iVar1 = Min_CoverCountCubes(pCover);
    iVar2 = Min_CoverCountCubes(pCover_01);
    if (iVar1 <= iVar2) goto LAB_003414e8;
    if (pCover_00 != (Min_Cube_t *)0x0) goto LAB_003413e1;
    bVar7 = true;
LAB_00341467:
    iVar1 = Min_CoverCountCubes(pCover_01);
    iVar2 = Min_CoverCountCubes(pCover);
    if (iVar2 <= iVar1) goto LAB_003414ba;
  }
  local_54 = 'x';
  local_44 = 0;
  pCover_02 = pCover_01;
  if (!bVar7) {
    iVar1 = Min_CoverCountCubes(pCover_01);
    iVar2 = Min_CoverCountCubes(pCover_00);
    if (iVar2 <= iVar1) {
LAB_003414ba:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/cov/covBuild.c"
                    ,0x1ba,"Abc_Obj_t *Abc_NtkCovDerive_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *)")
      ;
    }
  }
LAB_003414e8:
  for (iVar1 = 0; iVar1 < vSupp->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vSupp,iVar1);
    pAVar4 = Abc_NtkObj(pObj->pNtk,iVar2);
    Abc_NtkCovDerive_rec(p,pNtkNew,pAVar4);
  }
  iVar1 = Min_CoverCountCubes(pCover_02);
  if (iVar1 == 1) {
    pAVar4 = Abc_NtkCovDeriveCube(pNtkNew,pObj,pCover_02,vSupp,local_44);
  }
  else if (iVar1 == 0) {
    pAVar4 = Abc_NtkCreateNodeConst0(pNtkNew);
  }
  else {
    pAVar4 = Abc_NtkCreateNode(pNtkNew);
    for (iVar1 = 0; iVar1 < vSupp->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vSupp,iVar1);
      pAVar5 = Abc_NtkObj(pObj->pNtk,iVar2);
      Abc_ObjAddFanin(pAVar4,(pAVar5->field_6).pCopy);
    }
    vCover = (Vec_Str_t *)malloc(0x10);
    vCover->nCap = 100;
    vCover->nSize = 0;
    pcVar6 = (char *)malloc(100);
    vCover->pArray = pcVar6;
    Min_CoverCreate(vCover,pCover_02,local_54);
    pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,vCover->pArray);
    (pAVar4->field_5).pData = pcVar6;
    free(vCover->pArray);
    free(vCover);
  }
  (pObj->field_6).pCopy = pAVar4;
  return pAVar4;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDerive_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fVerbose = 0;
    Min_Cube_t * pCover, * pCovers[3];
    Abc_Obj_t * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    Vec_Str_t * vCover;
    int i, Entry, nCubes, Type;
    // skip if already computed
    if ( pObj->pCopy )
        return pObj->pCopy;
    assert( Abc_ObjIsNode(pObj) );
    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    assert( vSupp );
    // choose the cover to implement
    pCovers[0] = Abc_ObjGetCover( pObj, 0 );
    pCovers[1] = Abc_ObjGetCover( pObj, 1 );
    pCovers[2] = Abc_ObjGetCover2( pObj );
    // use positive polarity
    if ( pCovers[0] 
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[1]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[0]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[0];
        Type = '1';
    }
    else 
    // use negative polarity
    if ( pCovers[1] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[2] || Min_CoverCountCubes(pCovers[1]) <= Min_CoverCountCubes(pCovers[2]))   )
    {
        pCover = pCovers[1];
        Type = '0';
    }
    else 
    // use XOR polarity
    if ( pCovers[2] 
        && (!pCovers[0] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[0]))
        && (!pCovers[1] || Min_CoverCountCubes(pCovers[2]) < Min_CoverCountCubes(pCovers[1]))   )
    {
        pCover = pCovers[2];
        Type = 'x';
    }
    else
        assert( 0 );
    // print the support of this node
    if ( fVerbose )
    {
        printf( "{ " );
        Vec_IntForEachEntry( vSupp, Entry, i )
            printf( "%d ", Entry );
        printf( "}  cubes = %d\n", Min_CoverCountCubes( pCover ) );
    }
    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDerive_rec( p, pNtkNew, pFanin );
    }
    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCube( pNtkNew, pObj, pCover, vSupp, Type == '0' );
    else
    {
        // create the node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Vec_IntForEachEntry( vSupp, Entry, i )
        {
            pFanin = Abc_NtkObj(pObj->pNtk, Entry);
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // derive the function
        vCover = Vec_StrAlloc( 100 );
        Min_CoverCreate( vCover, pCover, (char)Type );
        pNodeNew->pData = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vCover) );
        Vec_StrFree( vCover );
    }

/*
    printf( "Created node %d(%d) at level %d: ", pNodeNew->Id, pObj->Id, Level );
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        printf( "%d(%d) ", pFanin->pCopy->Id, pFanin->Id );
    }
    printf( "\n" );
    Min_CoverWrite( stdout, pCover );
*/
    return pObj->pCopy = pNodeNew;
}